

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestMapLite::_InternalSerialize
          (TestMapLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  UntypedMapBase *pUVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference key;
  reference key_00;
  reference key_01;
  reference key_02;
  reference key_03;
  reference key_04;
  reference key_05;
  reference key_06;
  reference key_07;
  reference key_08;
  reference key_09;
  reference key_10;
  reference key_11;
  reference key_12;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  void *data;
  value_type *entry_35;
  const_iterator __end3_35;
  const_iterator __begin3_35;
  Map<int,_int> *__range3_35;
  value_type *entry_34;
  const_iterator __end3_34;
  const_iterator __begin3_34;
  MapSorterFlat<google::protobuf::Map<int,_int>_> *__range3_34;
  Map<int,_int> *field_17;
  value_type *entry_33;
  const_iterator __end3_33;
  const_iterator __begin3_33;
  Map<int,_proto2_unittest::ForeignMessageLite> *__range3_33;
  value_type *entry_32;
  const_iterator __end3_32;
  const_iterator __begin3_32;
  MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_> *__range3_32;
  Map<int,_proto2_unittest::ForeignMessageLite> *field_16;
  value_type *entry_31;
  const_iterator __end3_31;
  const_iterator __begin3_31;
  Map<int,_proto2_unittest::MapEnumLite> *__range3_31;
  value_type *entry_30;
  const_iterator __end3_30;
  const_iterator __begin3_30;
  MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_> *__range3_30;
  Map<int,_proto2_unittest::MapEnumLite> *field_15;
  value_type *entry_29;
  const_iterator __end3_29;
  const_iterator __begin3_29;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_29;
  value_type *entry_28;
  const_iterator __end3_28;
  const_iterator __begin3_28;
  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_28;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field_14;
  value_type *entry_27;
  const_iterator __end3_27;
  const_iterator __begin3_27;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_27;
  value_type *entry_26;
  const_iterator __end3_26;
  const_iterator __begin3_26;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_26;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field_13;
  value_type *entry_25;
  const_iterator __end3_25;
  const_iterator __begin3_25;
  Map<bool,_bool> *__range3_25;
  value_type *entry_24;
  const_iterator __end3_24;
  const_iterator __begin3_24;
  MapSorterFlat<google::protobuf::Map<bool,_bool>_> *__range3_24;
  Map<bool,_bool> *field_12;
  value_type *entry_23;
  const_iterator __end3_23;
  const_iterator __begin3_23;
  Map<int,_double> *__range3_23;
  value_type *entry_22;
  const_iterator __end3_22;
  const_iterator __begin3_22;
  MapSorterFlat<google::protobuf::Map<int,_double>_> *__range3_22;
  Map<int,_double> *field_11;
  value_type *entry_21;
  const_iterator __end3_21;
  const_iterator __begin3_21;
  Map<int,_float> *__range3_21;
  value_type *entry_20;
  const_iterator __end3_20;
  const_iterator __begin3_20;
  MapSorterFlat<google::protobuf::Map<int,_float>_> *__range3_20;
  Map<int,_float> *field_10;
  value_type *entry_19;
  const_iterator __end3_19;
  const_iterator __begin3_19;
  Map<long,_long> *__range3_19;
  value_type *entry_18;
  const_iterator __end3_18;
  const_iterator __begin3_18;
  MapSorterFlat<google::protobuf::Map<long,_long>_> *__range3_18;
  Map<long,_long> *field_9;
  value_type *entry_17;
  const_iterator __end3_17;
  const_iterator __begin3_17;
  Map<int,_int> *__range3_17;
  value_type *entry_16;
  const_iterator __end3_16;
  const_iterator __begin3_16;
  MapSorterFlat<google::protobuf::Map<int,_int>_> *__range3_16;
  Map<int,_int> *field_8;
  value_type *entry_15;
  const_iterator __end3_15;
  const_iterator __begin3_15;
  Map<unsigned_long,_unsigned_long> *__range3_15;
  value_type *entry_14;
  const_iterator __end3_14;
  const_iterator __begin3_14;
  MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *__range3_14;
  Map<unsigned_long,_unsigned_long> *field_7;
  value_type *entry_13;
  const_iterator __end3_13;
  const_iterator __begin3_13;
  Map<unsigned_int,_unsigned_int> *__range3_13;
  value_type *entry_12;
  const_iterator __end3_12;
  const_iterator __begin3_12;
  MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *__range3_12;
  Map<unsigned_int,_unsigned_int> *field_6;
  value_type *entry_11;
  const_iterator __end3_11;
  const_iterator __begin3_11;
  Map<long,_long> *__range3_11;
  value_type *entry_10;
  const_iterator __end3_10;
  const_iterator __begin3_10;
  MapSorterFlat<google::protobuf::Map<long,_long>_> *__range3_10;
  Map<long,_long> *field_5;
  value_type *entry_9;
  const_iterator __end3_9;
  const_iterator __begin3_9;
  Map<int,_int> *__range3_9;
  value_type *entry_8;
  const_iterator __end3_8;
  const_iterator __begin3_8;
  MapSorterFlat<google::protobuf::Map<int,_int>_> *__range3_8;
  Map<int,_int> *field_4;
  value_type *entry_7;
  const_iterator __end3_7;
  const_iterator __begin3_7;
  Map<unsigned_long,_unsigned_long> *__range3_7;
  value_type *entry_6;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *__range3_6;
  Map<unsigned_long,_unsigned_long> *field_3;
  value_type *entry_5;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  Map<unsigned_int,_unsigned_int> *__range3_5;
  value_type *entry_4;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *__range3_4;
  Map<unsigned_int,_unsigned_int> *field_2;
  value_type *entry_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  Map<long,_long> *__range3_3;
  value_type *entry_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  MapSorterFlat<google::protobuf::Map<long,_long>_> *__range3_2;
  Map<long,_long> *field_1;
  value_type *entry_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Map<int,_int> *__range3_1;
  value_type *entry;
  const_iterator __end3;
  MapSorterIt<std::pair<int,_const_void_*>_> local_58;
  const_iterator __begin3;
  MapSorterFlat<google::protobuf::Map<int,_int>_> *__range3;
  Map<int,_int> *field;
  uint32_t cached_has_bits;
  TestMapLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMapLite *this_local;
  
  pUVar2 = (UntypedMapBase *)_internal_map_int32_int32(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  stream_local = (EpsCopyOutputStream *)target;
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_int32(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3,
                 (Map<int,_int> *)pUVar2);
      local_58.ptr = (pair<int,_const_void_*> *)
                     google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::
                     begin((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3);
      entry = (value_type *)
              google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::end
                        ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&local_58,(MapSorterIt<std::pair<int,_const_void_*>_> *)&entry),
            bVar1) {
        pvVar10 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::
                  const_iterator::operator*((const_iterator *)&local_58);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                       ::InternalSerialize(1,&pvVar10->first,&pvVar10->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&local_58);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3);
    }
    else {
      google::protobuf::Map<int,_int>::begin
                ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_int> *)pUVar2);
      google::protobuf::Map<int,_int>::end((const_iterator *)&entry_1,(Map<int,_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_1), bVar1) {
        pvVar11 = google::protobuf::Map<int,_int>::const_iterator::operator*
                            ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                       ::InternalSerialize(1,&pvVar11->first,&pvVar11->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int64_int64(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int64_int64(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_2,
                 (Map<long,_long> *)pUVar2);
      __end3_2 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                 begin((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_2);
      entry_2 = (value_type *)
                google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::end
                          ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_2);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::
                     operator!=(&__end3_2.super_MapSorterIt<std::pair<long,_const_void_*>_>,
                                (MapSorterIt<std::pair<long,_const_void_*>_> *)&entry_2), bVar1) {
        pvVar7 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                 const_iterator::operator*(&__end3_2);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                       ::InternalSerialize(2,&pvVar7->first,&pvVar7->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::operator++
                  (&__end3_2.super_MapSorterIt<std::pair<long,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_2);
    }
    else {
      google::protobuf::Map<long,_long>::begin
                ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_,
                 (Map<long,_long> *)pUVar2);
      google::protobuf::Map<long,_long>::end((const_iterator *)&entry_3,(Map<long,_long> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_3), bVar1) {
        pvVar8 = google::protobuf::Map<long,_long>::const_iterator::operator*
                           ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                       ::InternalSerialize(2,&pvVar8->first,&pvVar8->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<long,_long>::const_iterator::operator++
                  ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_uint32_uint32(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_uint32_uint32(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                      &__begin3_4,(Map<unsigned_int,_unsigned_int> *)pUVar2);
      __end3_4 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::begin
                           ((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                            &__begin3_4);
      entry_4 = (value_type *)
                google::protobuf::internal::
                MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::end
                          ((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                           &__begin3_4);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<unsigned_int,_const_void_*>_>
                     ::operator!=(&__end3_4.
                                   super_MapSorterIt<std::pair<unsigned_int,_const_void_*>_>,
                                  (MapSorterIt<std::pair<unsigned_int,_const_void_*>_> *)&entry_4),
            bVar1) {
        pvVar3 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::const_iterator::
                 operator*(&__end3_4);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                       ::InternalSerialize(3,&pvVar3->first,&pvVar3->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<unsigned_int,_const_void_*>_>::operator++
                  (&__end3_4.super_MapSorterIt<std::pair<unsigned_int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::~MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                       &__begin3_4);
    }
    else {
      google::protobuf::Map<unsigned_int,_unsigned_int>::begin
                ((const_iterator *)&__end3_5.super_UntypedMapIterator.bucket_index_,
                 (Map<unsigned_int,_unsigned_int> *)pUVar2);
      google::protobuf::Map<unsigned_int,_unsigned_int>::end
                ((const_iterator *)&entry_5,(Map<unsigned_int,_unsigned_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_5.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_5), bVar1) {
        pvVar4 = google::protobuf::Map<unsigned_int,_unsigned_int>::const_iterator::operator*
                           ((const_iterator *)&__end3_5.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                       ::InternalSerialize(3,&pvVar4->first,&pvVar4->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<unsigned_int,_unsigned_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_5.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_uint64_uint64(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_uint64_uint64(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3_6,
                 (Map<unsigned_long,_unsigned_long> *)pUVar2);
      __end3_6 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::begin
                           ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)
                            &__begin3_6);
      entry_6 = (value_type *)
                google::protobuf::internal::
                MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::end
                          ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)
                           &__begin3_6);
      while (bVar1 = google::protobuf::internal::
                     MapSorterIt<std::pair<unsigned_long,_const_void_*>_>::operator!=
                               (&__end3_6.super_MapSorterIt<std::pair<unsigned_long,_const_void_*>_>
                                ,(MapSorterIt<std::pair<unsigned_long,_const_void_*>_> *)&entry_6),
            bVar1) {
        pvVar5 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::const_iterator
                 ::operator*(&__end3_6);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                       ::InternalSerialize(4,&pvVar5->first,&pvVar5->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<unsigned_long,_const_void_*>_>::operator++
                  (&__end3_6.super_MapSorterIt<std::pair<unsigned_long,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3_6)
      ;
    }
    else {
      google::protobuf::Map<unsigned_long,_unsigned_long>::begin
                ((const_iterator *)&__end3_7.super_UntypedMapIterator.bucket_index_,
                 (Map<unsigned_long,_unsigned_long> *)pUVar2);
      google::protobuf::Map<unsigned_long,_unsigned_long>::end
                ((const_iterator *)&entry_7,(Map<unsigned_long,_unsigned_long> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_7.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_7), bVar1) {
        pvVar6 = google::protobuf::Map<unsigned_long,_unsigned_long>::const_iterator::operator*
                           ((const_iterator *)&__end3_7.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                       ::InternalSerialize(4,&pvVar6->first,&pvVar6->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<unsigned_long,_unsigned_long>::const_iterator::operator++
                  ((const_iterator *)&__end3_7.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_sint32_sint32(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_sint32_sint32(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_8,
                 (Map<int,_int> *)pUVar2);
      __end3_8 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::begin
                           ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_8);
      entry_8 = (value_type *)
                google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::end
                          ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_8);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_8.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_8), bVar1) {
        pvVar10 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::
                  const_iterator::operator*(&__end3_8);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                       ::InternalSerialize(5,&pvVar10->first,&pvVar10->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_8.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_8);
    }
    else {
      google::protobuf::Map<int,_int>::begin
                ((const_iterator *)&__end3_9.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_int> *)pUVar2);
      google::protobuf::Map<int,_int>::end((const_iterator *)&entry_9,(Map<int,_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_9.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_9), bVar1) {
        pvVar11 = google::protobuf::Map<int,_int>::const_iterator::operator*
                            ((const_iterator *)&__end3_9.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                       ::InternalSerialize(5,&pvVar11->first,&pvVar11->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_9.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_sint64_sint64(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_sint64_sint64(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_10,
                 (Map<long,_long> *)pUVar2);
      __end3_10 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                  begin((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_10);
      entry_10 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::end
                           ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_10);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::
                     operator!=(&__end3_10.super_MapSorterIt<std::pair<long,_const_void_*>_>,
                                (MapSorterIt<std::pair<long,_const_void_*>_> *)&entry_10), bVar1) {
        pvVar7 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                 const_iterator::operator*(&__end3_10);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                       ::InternalSerialize(6,&pvVar7->first,&pvVar7->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::operator++
                  (&__end3_10.super_MapSorterIt<std::pair<long,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_10);
    }
    else {
      google::protobuf::Map<long,_long>::begin
                ((const_iterator *)&__end3_11.super_UntypedMapIterator.bucket_index_,
                 (Map<long,_long> *)pUVar2);
      google::protobuf::Map<long,_long>::end((const_iterator *)&entry_11,(Map<long,_long> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_11.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_11), bVar1) {
        pvVar8 = google::protobuf::Map<long,_long>::const_iterator::operator*
                           ((const_iterator *)&__end3_11.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                       ::InternalSerialize(6,&pvVar8->first,&pvVar8->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<long,_long>::const_iterator::operator++
                  ((const_iterator *)&__end3_11.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_fixed32_fixed32(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_fixed32_fixed32(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                      &__begin3_12,(Map<unsigned_int,_unsigned_int> *)pUVar2);
      __end3_12 = google::protobuf::internal::
                  MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::begin
                            ((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                             &__begin3_12);
      entry_12 = (value_type *)
                 google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::end
                           ((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                            &__begin3_12);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<unsigned_int,_const_void_*>_>
                     ::operator!=(&__end3_12.
                                   super_MapSorterIt<std::pair<unsigned_int,_const_void_*>_>,
                                  (MapSorterIt<std::pair<unsigned_int,_const_void_*>_> *)&entry_12),
            bVar1) {
        pvVar3 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>::const_iterator::
                 operator*(&__end3_12);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                       ::InternalSerialize(7,&pvVar3->first,&pvVar3->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<unsigned_int,_const_void_*>_>::operator++
                  (&__end3_12.super_MapSorterIt<std::pair<unsigned_int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::~MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)
                       &__begin3_12);
    }
    else {
      google::protobuf::Map<unsigned_int,_unsigned_int>::begin
                ((const_iterator *)&__end3_13.super_UntypedMapIterator.bucket_index_,
                 (Map<unsigned_int,_unsigned_int> *)pUVar2);
      google::protobuf::Map<unsigned_int,_unsigned_int>::end
                ((const_iterator *)&entry_13,(Map<unsigned_int,_unsigned_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_13.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_13), bVar1) {
        pvVar4 = google::protobuf::Map<unsigned_int,_unsigned_int>::const_iterator::operator*
                           ((const_iterator *)&__end3_13.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                       ::InternalSerialize(7,&pvVar4->first,&pvVar4->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<unsigned_int,_unsigned_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_13.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_fixed64_fixed64(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_fixed64_fixed64(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3_14
                 ,(Map<unsigned_long,_unsigned_long> *)pUVar2);
      __end3_14 = google::protobuf::internal::
                  MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::begin
                            ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)
                             &__begin3_14);
      entry_14 = (value_type *)
                 google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::end
                           ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)
                            &__begin3_14);
      while (bVar1 = google::protobuf::internal::
                     MapSorterIt<std::pair<unsigned_long,_const_void_*>_>::operator!=
                               (&__end3_14.
                                 super_MapSorterIt<std::pair<unsigned_long,_const_void_*>_>,
                                (MapSorterIt<std::pair<unsigned_long,_const_void_*>_> *)&entry_14),
            bVar1) {
        pvVar5 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::const_iterator
                 ::operator*(&__end3_14);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                       ::InternalSerialize(8,&pvVar5->first,&pvVar5->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<unsigned_long,_const_void_*>_>::operator++
                  (&__end3_14.super_MapSorterIt<std::pair<unsigned_long,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3_14
                );
    }
    else {
      google::protobuf::Map<unsigned_long,_unsigned_long>::begin
                ((const_iterator *)&__end3_15.super_UntypedMapIterator.bucket_index_,
                 (Map<unsigned_long,_unsigned_long> *)pUVar2);
      google::protobuf::Map<unsigned_long,_unsigned_long>::end
                ((const_iterator *)&entry_15,(Map<unsigned_long,_unsigned_long> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_15.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_15), bVar1) {
        pvVar6 = google::protobuf::Map<unsigned_long,_unsigned_long>::const_iterator::operator*
                           ((const_iterator *)&__end3_15.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                       ::InternalSerialize(8,&pvVar6->first,&pvVar6->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::Map<unsigned_long,_unsigned_long>::const_iterator::operator++
                  ((const_iterator *)&__end3_15.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_sfixed32_sfixed32(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_sfixed32_sfixed32(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_16,
                 (Map<int,_int> *)pUVar2);
      __end3_16 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::begin
                            ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_16);
      entry_16 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::end
                           ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_16);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_16.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_16), bVar1) {
        pvVar10 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::
                  const_iterator::operator*(&__end3_16);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                       ::InternalSerialize(9,&pvVar10->first,&pvVar10->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_16.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_16);
    }
    else {
      google::protobuf::Map<int,_int>::begin
                ((const_iterator *)&__end3_17.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_int> *)pUVar2);
      google::protobuf::Map<int,_int>::end((const_iterator *)&entry_17,(Map<int,_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_17.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_17), bVar1) {
        pvVar11 = google::protobuf::Map<int,_int>::const_iterator::operator*
                            ((const_iterator *)&__end3_17.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                       ::InternalSerialize(9,&pvVar11->first,&pvVar11->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_17.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_sfixed64_sfixed64(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_sfixed64_sfixed64(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_18,
                 (Map<long,_long> *)pUVar2);
      __end3_18 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                  begin((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_18);
      entry_18 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::end
                           ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_18);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::
                     operator!=(&__end3_18.super_MapSorterIt<std::pair<long,_const_void_*>_>,
                                (MapSorterIt<std::pair<long,_const_void_*>_> *)&entry_18), bVar1) {
        pvVar7 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::
                 const_iterator::operator*(&__end3_18);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                       ::InternalSerialize(10,&pvVar7->first,&pvVar7->second,(uint8_t *)stream_local
                                           ,stream);
        google::protobuf::internal::MapSorterIt<std::pair<long,_const_void_*>_>::operator++
                  (&__end3_18.super_MapSorterIt<std::pair<long,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3_18);
    }
    else {
      google::protobuf::Map<long,_long>::begin
                ((const_iterator *)&__end3_19.super_UntypedMapIterator.bucket_index_,
                 (Map<long,_long> *)pUVar2);
      google::protobuf::Map<long,_long>::end((const_iterator *)&entry_19,(Map<long,_long> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_19.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_19), bVar1) {
        pvVar8 = google::protobuf::Map<long,_long>::const_iterator::operator*
                           ((const_iterator *)&__end3_19.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                       ::InternalSerialize(10,&pvVar8->first,&pvVar8->second,(uint8_t *)stream_local
                                           ,stream);
        google::protobuf::Map<long,_long>::const_iterator::operator++
                  ((const_iterator *)&__end3_19.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int32_float(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_float(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&__begin3_20,
                 (Map<int,_float> *)pUVar2);
      __end3_20 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::
                  begin((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&__begin3_20);
      entry_20 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::end
                           ((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&__begin3_20);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_20.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_20), bVar1) {
        key = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::
              const_iterator::operator*(&__end3_20);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                       ::InternalSerialize(0xb,&key->first,&key->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_20.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&__begin3_20);
    }
    else {
      google::protobuf::Map<int,_float>::begin
                ((const_iterator *)&__end3_21.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_float> *)pUVar2);
      google::protobuf::Map<int,_float>::end((const_iterator *)&entry_21,(Map<int,_float> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_21.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_21), bVar1) {
        key_00 = google::protobuf::Map<int,_float>::const_iterator::operator*
                           ((const_iterator *)&__end3_21.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                       ::InternalSerialize(0xb,&key_00->first,&key_00->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_float>::const_iterator::operator++
                  ((const_iterator *)&__end3_21.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int32_double(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_double(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&__begin3_22,
                 (Map<int,_double> *)pUVar2);
      __end3_22 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::
                  begin((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&__begin3_22);
      entry_22 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::end
                           ((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&__begin3_22);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_22.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_22), bVar1) {
        key_01 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::
                 const_iterator::operator*(&__end3_22);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                       ::InternalSerialize(0xc,&key_01->first,&key_01->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_22.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&__begin3_22);
    }
    else {
      google::protobuf::Map<int,_double>::begin
                ((const_iterator *)&__end3_23.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_double> *)pUVar2);
      google::protobuf::Map<int,_double>::end
                ((const_iterator *)&entry_23,(Map<int,_double> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_23.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_23), bVar1) {
        key_02 = google::protobuf::Map<int,_double>::const_iterator::operator*
                           ((const_iterator *)&__end3_23.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                       ::InternalSerialize(0xc,&key_02->first,&key_02->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_double>::const_iterator::operator++
                  ((const_iterator *)&__end3_23.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_bool_bool(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_bool_bool(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&__begin3_24,
                 (Map<bool,_bool> *)pUVar2);
      __end3_24 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::
                  begin((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&__begin3_24);
      entry_24 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::end
                           ((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&__begin3_24);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<bool,_const_void_*>_>::
                     operator!=(&__end3_24.super_MapSorterIt<std::pair<bool,_const_void_*>_>,
                                (MapSorterIt<std::pair<bool,_const_void_*>_> *)&entry_24), bVar1) {
        key_03 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::
                 const_iterator::operator*(&__end3_24);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                       ::InternalSerialize(0xd,&key_03->first,&key_03->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<bool,_const_void_*>_>::operator++
                  (&__end3_24.super_MapSorterIt<std::pair<bool,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&__begin3_24);
    }
    else {
      google::protobuf::Map<bool,_bool>::begin
                ((const_iterator *)&__end3_25.super_UntypedMapIterator.bucket_index_,
                 (Map<bool,_bool> *)pUVar2);
      google::protobuf::Map<bool,_bool>::end((const_iterator *)&entry_25,(Map<bool,_bool> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_25.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_25), bVar1) {
        key_04 = google::protobuf::Map<bool,_bool>::const_iterator::operator*
                           ((const_iterator *)&__end3_25.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                       ::InternalSerialize(0xd,&key_04->first,&key_04->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<bool,_bool>::const_iterator::operator++
                  ((const_iterator *)&__end3_25.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_string_string_abi_cxx11_(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_string_string_abi_cxx11_(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin3_26,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pUVar2);
      __end3_26 = google::protobuf::internal::
                  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__begin3_26);
      entry_26 = (value_type *)
                 google::protobuf::internal::
                 MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3_26);
      while (bVar1 = google::protobuf::internal::MapSorterIt<const_void_*>::operator!=
                               (&__end3_26.super_MapSorterIt<const_void_*>,
                                (MapSorterIt<const_void_*> *)&entry_26), bVar1) {
        key_05 = google::protobuf::internal::
                 MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::const_iterator::operator*(&__end3_26);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(0xe,&key_05->first,&key_05->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<const_void_*>::operator++
                  (&__end3_26.super_MapSorterIt<const_void_*>);
      }
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3_26);
    }
    else {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::begin((const_iterator *)&__end3_27.super_UntypedMapIterator.bucket_index_,
              (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)pUVar2);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end((const_iterator *)&entry_27,
            (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_27.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_27), bVar1) {
        key_06 = google::protobuf::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::const_iterator::operator*
                           ((const_iterator *)&__end3_27.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(0xe,&key_06->first,&key_06->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::const_iterator::operator++
                  ((const_iterator *)&__end3_27.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int32_bytes_abi_cxx11_(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_bytes_abi_cxx11_(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3_28,
                      (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pUVar2);
      __end3_28 = google::protobuf::internal::
                  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__begin3_28);
      entry_28 = (value_type *)
                 google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3_28);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_28.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_28), bVar1) {
        key_07 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::const_iterator::operator*(&__end3_28);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                       ::InternalSerialize(0xf,&key_07->first,&key_07->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_28.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3_28);
    }
    else {
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      begin((const_iterator *)&__end3_29.super_UntypedMapIterator.bucket_index_,
            (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pUVar2);
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      end((const_iterator *)&entry_29,
          (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_29.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_29), bVar1) {
        key_08 = google::protobuf::
                 Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::const_iterator::operator*
                           ((const_iterator *)&__end3_29.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                       ::InternalSerialize(0xf,&key_08->first,&key_08->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::
        Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        const_iterator::operator++
                  ((const_iterator *)&__end3_29.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int32_enum(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_enum(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_> *)
                 &__begin3_30,(Map<int,_proto2_unittest::MapEnumLite> *)pUVar2);
      __end3_30 = google::protobuf::internal::
                  MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::begin
                            ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>
                              *)&__begin3_30);
      entry_30 = (value_type *)
                 google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::end
                           ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>
                             *)&__begin3_30);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_30.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_30), bVar1) {
        key_09 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::
                 const_iterator::operator*(&__end3_30);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                       ::InternalSerialize(0x10,&key_09->first,&key_09->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_30.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_> *)
                 &__begin3_30);
    }
    else {
      google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::begin
                ((const_iterator *)&__end3_31.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_proto2_unittest::MapEnumLite> *)pUVar2);
      google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::end
                ((const_iterator *)&entry_31,(Map<int,_proto2_unittest::MapEnumLite> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_31.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_31), bVar1) {
        key_10 = google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::const_iterator::operator*
                           ((const_iterator *)&__end3_31.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                       ::InternalSerialize(0x10,&key_10->first,&key_10->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::const_iterator::operator++
                  ((const_iterator *)&__end3_31.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_map_int32_foreign_message(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_map_int32_foreign_message(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_> *)
                 &__begin3_32,(Map<int,_proto2_unittest::ForeignMessageLite> *)pUVar2);
      __end3_32 = google::protobuf::internal::
                  MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::
                  begin((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>
                         *)&__begin3_32);
      entry_32 = (value_type *)
                 google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::
                 end((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>
                      *)&__begin3_32);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_32.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_32), bVar1) {
        key_11 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::
                 const_iterator::operator*(&__end3_32);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                       ::InternalSerialize(0x11,&key_11->first,&key_11->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_32.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::
      ~MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>
                      *)&__begin3_32);
    }
    else {
      google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>::begin
                ((const_iterator *)&__end3_33.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_proto2_unittest::ForeignMessageLite> *)pUVar2);
      google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>::end
                ((const_iterator *)&entry_33,(Map<int,_proto2_unittest::ForeignMessageLite> *)pUVar2
                );
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_33.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_33), bVar1) {
        key_12 = google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>::const_iterator::
                 operator*((const_iterator *)&__end3_33.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                       ::InternalSerialize(0x11,&key_12->first,&key_12->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>::const_iterator::operator++
                  ((const_iterator *)&__end3_33.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar2 = (UntypedMapBase *)_internal_teboring(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar2);
  if (!bVar1) {
    pUVar2 = (UntypedMapBase *)_internal_teboring(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar9 = google::protobuf::internal::UntypedMapBase::size(pUVar2), 1 < sVar9)) {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_34,
                 (Map<int,_int> *)pUVar2);
      __end3_34 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::begin
                            ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_34);
      entry_34 = (value_type *)
                 google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::end
                           ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_34);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_34.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_34), bVar1) {
        pvVar10 = google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::
                  const_iterator::operator*(&__end3_34);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                       ::InternalSerialize(0x12,&pvVar10->first,&pvVar10->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_34.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::~MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3_34);
    }
    else {
      google::protobuf::Map<int,_int>::begin
                ((const_iterator *)&__end3_35.super_UntypedMapIterator.bucket_index_,
                 (Map<int,_int> *)pUVar2);
      google::protobuf::Map<int,_int>::end((const_iterator *)&entry_35,(Map<int,_int> *)pUVar2);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_35.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_35), bVar1) {
        pvVar11 = google::protobuf::Map<int,_int>::const_iterator::operator*
                            ((const_iterator *)&__end3_35.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                       ::InternalSerialize(0x12,&pvVar11->first,&pvVar11->second,
                                           (uint8_t *)stream_local,stream);
        google::protobuf::Map<int,_int>::const_iterator::operator++
                  ((const_iterator *)&__end3_35.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMapLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMapLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, int32> map_int32_int32 = 1;
  if (!this_._internal_map_int32_int32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_map_int32_int32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int64, int64> map_int64_int64 = 2;
  if (!this_._internal_map_int64_int64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_INT64,
                                   _pbi::WireFormatLite::TYPE_INT64>;
    const auto& field = this_._internal_map_int64_int64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint32, uint32> map_uint32_uint32 = 3;
  if (!this_._internal_map_uint32_uint32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_UINT32,
                                   _pbi::WireFormatLite::TYPE_UINT32>;
    const auto& field = this_._internal_map_uint32_uint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint64, uint64> map_uint64_uint64 = 4;
  if (!this_._internal_map_uint64_uint64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_UINT64,
                                   _pbi::WireFormatLite::TYPE_UINT64>;
    const auto& field = this_._internal_map_uint64_uint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint32, sint32> map_sint32_sint32 = 5;
  if (!this_._internal_map_sint32_sint32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SINT32,
                                   _pbi::WireFormatLite::TYPE_SINT32>;
    const auto& field = this_._internal_map_sint32_sint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint64, sint64> map_sint64_sint64 = 6;
  if (!this_._internal_map_sint64_sint64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SINT64,
                                   _pbi::WireFormatLite::TYPE_SINT64>;
    const auto& field = this_._internal_map_sint64_sint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed32, fixed32> map_fixed32_fixed32 = 7;
  if (!this_._internal_map_fixed32_fixed32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_FIXED32,
                                   _pbi::WireFormatLite::TYPE_FIXED32>;
    const auto& field = this_._internal_map_fixed32_fixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed64, fixed64> map_fixed64_fixed64 = 8;
  if (!this_._internal_map_fixed64_fixed64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_FIXED64,
                                   _pbi::WireFormatLite::TYPE_FIXED64>;
    const auto& field = this_._internal_map_fixed64_fixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed32, sfixed32> map_sfixed32_sfixed32 = 9;
  if (!this_._internal_map_sfixed32_sfixed32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED32,
                                   _pbi::WireFormatLite::TYPE_SFIXED32>;
    const auto& field = this_._internal_map_sfixed32_sfixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed64, sfixed64> map_sfixed64_sfixed64 = 10;
  if (!this_._internal_map_sfixed64_sfixed64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED64,
                                   _pbi::WireFormatLite::TYPE_SFIXED64>;
    const auto& field = this_._internal_map_sfixed64_sfixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, float> map_int32_float = 11;
  if (!this_._internal_map_int32_float().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, float>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, float,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_FLOAT>;
    const auto& field = this_._internal_map_int32_float();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, double> map_int32_double = 12;
  if (!this_._internal_map_int32_double().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, double>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, double,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_DOUBLE>;
    const auto& field = this_._internal_map_int32_double();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<bool, bool> map_bool_bool = 13;
  if (!this_._internal_map_bool_bool().empty()) {
    using MapType = ::google::protobuf::Map<bool, bool>;
    using WireHelper = _pbi::MapEntryFuncs<bool, bool,
                                   _pbi::WireFormatLite::TYPE_BOOL,
                                   _pbi::WireFormatLite::TYPE_BOOL>;
    const auto& field = this_._internal_map_bool_bool();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<string, string> map_string_string = 14;
  if (!this_._internal_map_string_string().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, bytes> map_int32_bytes = 15;
  if (!this_._internal_map_int32_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_int32_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.MapEnumLite> map_int32_enum = 16;
  if (!this_._internal_map_int32_enum().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::MapEnumLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::MapEnumLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_ENUM>;
    const auto& field = this_._internal_map_int32_enum();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.ForeignMessageLite> map_int32_foreign_message = 17;
  if (!this_._internal_map_int32_foreign_message().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::ForeignMessageLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::ForeignMessageLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_map_int32_foreign_message();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, int32> teboring = 18;
  if (!this_._internal_teboring().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_teboring();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMapLite)
  return target;
}